

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O1

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::AddSDESPrivateItem
          (RTCPCompoundPacketBuilder *this,void *prefixdata,uint8_t prefixlength,void *valuedata,
          uint8_t valuelength)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  RTPMemoryManager *pRVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  uint8_t *buf;
  ulong __n;
  uint8_t itemdatalength;
  ulong uVar8;
  
  iVar5 = -0x2a;
  if (this->arebuilding == true) {
    if ((this->sdes).sdessources.
        super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
        ._M_impl._M_node.super__List_node_base._M_next ==
        (_List_node_base *)&(this->sdes).sdessources) {
      iVar5 = -0x28;
    }
    else {
      __n = (ulong)prefixlength;
      lVar1 = __n + valuelength;
      uVar8 = lVar1 + 1;
      iVar5 = -0x2e;
      if (uVar8 < 0x100) {
        sVar2 = this->appsize;
        sVar3 = this->byesize;
        sVar6 = Report::NeededBytes(&this->report);
        itemdatalength = (uint8_t)uVar8;
        sVar7 = SDES::NeededBytesWithExtraItem(&this->sdes,itemdatalength);
        iVar5 = -0x2b;
        if (sVar7 + sVar6 + sVar2 + sVar3 <= this->maximumpacketsize) {
          uVar8 = lVar1 + 3;
          pRVar4 = (this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr;
          if (pRVar4 == (RTPMemoryManager *)0x0) {
            buf = (uint8_t *)operator_new__(uVar8);
          }
          else {
            buf = (uint8_t *)(**(code **)(*(long *)pRVar4 + 0x10))(pRVar4,uVar8,7);
          }
          if (buf == (uint8_t *)0x0) {
            iVar5 = -1;
          }
          else {
            *buf = '\b';
            buf[1] = itemdatalength;
            buf[2] = prefixlength;
            if (prefixlength != '\0') {
              memcpy(buf + 3,prefixdata,__n);
            }
            if (valuelength != '\0') {
              memcpy(buf + __n + 3,valuedata,(ulong)valuelength);
            }
            SDES::AddItem(&this->sdes,buf,uVar8);
            iVar5 = 0;
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int RTCPCompoundPacketBuilder::AddSDESPrivateItem(const void *prefixdata,uint8_t prefixlength,const void *valuedata,
                                                  uint8_t valuelength)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;
	if (sdes.sdessources.empty())
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOCURRENTSOURCE;

	size_t itemlength = ((size_t)prefixlength)+1+((size_t)valuelength);
	if (itemlength > 255)
		return ERR_RTP_RTCPCOMPPACKBUILDER_TOTALITEMLENGTHTOOBIG;
	
#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalotherbytes = byesize+appsize+report.NeededBytes();
#else
	size_t totalotherbytes = byesize+appsize+unknownsize+report.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	size_t sdessizewithextraitem = sdes.NeededBytesWithExtraItem(itemlength);

	if ((sdessizewithextraitem+totalotherbytes) > maximumpacketsize)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;

	uint8_t *buf;
	size_t len;

	buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPSDESBLOCK) uint8_t[sizeof(RTCPSDESHeader)+itemlength];
	if (buf == 0)
		return ERR_RTP_OUTOFMEM;
	len = sizeof(RTCPSDESHeader)+(size_t)itemlength;

	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(buf);

	sdeshdr->sdesid = RTCP_SDES_ID_PRIVATE;
	sdeshdr->length = itemlength;
	
	buf[sizeof(RTCPSDESHeader)] = prefixlength;
	if (prefixlength != 0)
		memcpy((buf+sizeof(RTCPSDESHeader)+1),prefixdata,(size_t)prefixlength);
	if (valuelength != 0)
		memcpy((buf+sizeof(RTCPSDESHeader)+1+(size_t)prefixlength),valuedata,(size_t)valuelength);

	sdes.AddItem(buf,len);
	return 0;
}